

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateMemberAccess(ExpressionEvalContext *ctx,ExprMemberAccess *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  VariableData *pVVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  TypeRef *type;
  uchar *ptr;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
    return pEVar8;
  }
  bVar5 = AddInstruction(ctx);
  if ((bVar5) && (pEVar8 = Evaluate(ctx,expression->value), pEVar8 != (ExprBase *)0x0)) {
    if (pEVar8->typeID == 0xc) {
      pVVar4 = expression->member->variable;
      ptr = (uchar *)((ulong)pVVar4->offset + (long)pEVar8[1]._vptr_ExprBase);
      if (*(uchar **)&pEVar8[1].typeID < ptr + pVVar4->type->size) {
        __assert_fail("ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x62b,
                      "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)")
        ;
      }
      pAVar1 = ctx->ctx->allocator;
      iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
      pSVar2 = (expression->super_ExprBase).source;
      type = ExpressionContext::GetReferenceType(ctx->ctx,expression->member->variable->type);
      ExprPointerLiteral::ExprPointerLiteral
                ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar6),pSVar2,&type->super_TypeBase,
                 ptr,ptr + expression->member->variable->type->size);
      pEVar8 = CheckType(&expression->super_ExprBase,(ExprBase *)CONCAT44(extraout_var_00,iVar6));
      return pEVar8;
    }
    if (pEVar8->typeID == 9) {
      Report(ctx,"ERROR: member access of null pointer");
      return (ExprBase *)0x0;
    }
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x62a,
                  "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateMemberAccess(ExpressionEvalContext &ctx, ExprMemberAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: member access of null pointer");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + expression->member->variable->offset;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(expression->member->variable->type), targetPtr, targetPtr + expression->member->variable->type->size);

	return CheckType(expression, shifted);
}